

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_link.c
# Opt level: O3

int metacall_link_destroy(void)

{
  int iVar1;
  char *name;
  detour d;
  uint uVar2;
  
  threading_mutex_lock(&link_mutex);
  if (detour_link_handle == (detour_handle)0x0) {
    uVar2 = 0;
  }
  else {
    name = metacall_detour();
    d = detour_create(name);
    iVar1 = detour_uninstall(d,detour_link_handle);
    if (iVar1 != 0) {
      log_write_impl_va("metacall",0xd0,"metacall_link_destroy",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall_link.c"
                        ,LOG_LEVEL_ERROR,"MetaCall invalid detour fork uninstall");
    }
    uVar2 = (uint)(iVar1 != 0);
    detour_link_handle = (detour_handle)0x0;
  }
  if (metacall_link_table != (set)0x0) {
    set_destroy(metacall_link_table);
    metacall_link_table = (set)0x0;
  }
  threading_mutex_unlock(&link_mutex);
  threading_mutex_destroy(&link_mutex);
  return uVar2;
}

Assistant:

int metacall_link_destroy(void)
{
	int result = 0;

	threading_mutex_lock(&link_mutex);

	if (detour_link_handle != NULL)
	{
		detour d = detour_create(metacall_detour());

		if (detour_uninstall(d, detour_link_handle) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "MetaCall invalid detour fork uninstall");

			result = 1;
		}

		detour_link_handle = NULL;
	}

	if (metacall_link_table != NULL)
	{
		set_destroy(metacall_link_table);

		metacall_link_table = NULL;
	}

	threading_mutex_unlock(&link_mutex);

	threading_mutex_destroy(&link_mutex);

	return result;
}